

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

VTimeZone *
icu_63::VTimeZone::createVTimeZoneFromBasicTimeZone
          (BasicTimeZone *basic_time_zone,UErrorCode *status)

{
  UBool UVar1;
  VTimeZone *this;
  BasicTimeZone *pBVar2;
  VTimeZone *local_68;
  int32_t local_5c;
  UChar *pUStack_58;
  int32_t len;
  UChar *versionStr;
  UResourceBundle *bundle;
  undefined1 local_31;
  VTimeZone *local_30;
  VTimeZone *local_28;
  VTimeZone *vtz;
  UErrorCode *status_local;
  BasicTimeZone *basic_time_zone_local;
  
  vtz = (VTimeZone *)status;
  status_local = (UErrorCode *)basic_time_zone;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this = (VTimeZone *)UMemory::operator_new((UMemory *)0x120,(size_t)status);
    local_31 = 0;
    local_68 = (VTimeZone *)0x0;
    if (this != (VTimeZone *)0x0) {
      local_31 = 1;
      local_30 = this;
      VTimeZone(this);
      local_68 = this;
    }
    local_28 = local_68;
    if (local_68 == (VTimeZone *)0x0) {
      *(undefined4 *)&(vtz->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject = 7;
      basic_time_zone_local = (BasicTimeZone *)0x0;
    }
    else {
      pBVar2 = (BasicTimeZone *)
               (**(code **)(*(undefined8 *)status_local +
                           ~(U_ERROR_WARNING_START|U_STANDARD_ERROR_LIMIT)))();
      local_28->tz = pBVar2;
      if (local_28->tz == (BasicTimeZone *)0x0) {
        *(undefined4 *)&(vtz->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject = 7;
        if (local_28 != (VTimeZone *)0x0) {
          (*(local_28->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[1])();
        }
        basic_time_zone_local = (BasicTimeZone *)0x0;
      }
      else {
        TimeZone::getID(&local_28->tz->super_TimeZone,&local_28->olsonzid);
        versionStr = (UChar *)0x0;
        pUStack_58 = (UChar *)0x0;
        local_5c = 0;
        versionStr = (UChar *)ures_openDirect_63((char *)0x0,"zoneinfo64",(UErrorCode *)vtz);
        pUStack_58 = ures_getStringByKey_63
                               ((UResourceBundle *)versionStr,"TZVersion",&local_5c,
                                (UErrorCode *)vtz);
        UVar1 = ::U_SUCCESS(*(UErrorCode *)
                             &(vtz->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject)
        ;
        if (UVar1 != '\0') {
          UnicodeString::setTo(&local_28->icutzver,pUStack_58,local_5c);
        }
        ures_close_63((UResourceBundle *)versionStr);
        basic_time_zone_local = &local_28->super_BasicTimeZone;
      }
    }
  }
  else {
    basic_time_zone_local = (BasicTimeZone *)0x0;
  }
  return (VTimeZone *)basic_time_zone_local;
}

Assistant:

VTimeZone*
VTimeZone::createVTimeZoneFromBasicTimeZone(const BasicTimeZone& basic_time_zone, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return NULL;
    }
    VTimeZone *vtz = new VTimeZone();
    if (vtz == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    vtz->tz = (BasicTimeZone *)basic_time_zone.clone();
    if (vtz->tz == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        delete vtz;
        return NULL;
    }
    vtz->tz->getID(vtz->olsonzid);

    // Set ICU tzdata version
    UResourceBundle *bundle = NULL;
    const UChar* versionStr = NULL;
    int32_t len = 0;
    bundle = ures_openDirect(NULL, "zoneinfo64", &status);
    versionStr = ures_getStringByKey(bundle, "TZVersion", &len, &status);
    if (U_SUCCESS(status)) {
        vtz->icutzver.setTo(versionStr, len);
    }
    ures_close(bundle);
    return vtz;
}